

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::insertAction(QWidget *this,QAction *before,QAction *action)

{
  bool bVar1;
  QWidgetPrivate *t;
  qsizetype qVar2;
  QAction *in_RDX;
  QAction *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *apriv;
  int pos;
  QWidgetPrivate *d;
  QActionEvent e;
  QListSpecialMethodsBase<QAction_*> *in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 *local_58;
  undefined1 *local_50;
  QAction *in_stack_ffffffffffffffb8;
  char local_38 [32];
  QAction *local_18;
  QAction *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  if (in_RDX == (QAction *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               (char *)in_RDI);
    QMessageLogger::warning(local_38,"QWidget::insertAction: Attempt to insert null action");
  }
  else {
    local_18 = in_RDX;
    t = d_func((QWidget *)0x368b2d);
    bVar1 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                      (in_stack_ffffffffffffff80,(QAction **)in_RDI);
    if (bVar1) {
      removeAction(in_stack_ffffffffffffff88,in_stack_ffffffffffffffb8);
    }
    qVar2 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                      (in_stack_ffffffffffffff80,(QAction **)in_RDI,0x368b76);
    if ((int)qVar2 < 0) {
      local_10 = (QAction *)0x0;
      QList<QAction_*>::size(&t->actions);
    }
    QList<QAction_*>::insert
              ((QList<QAction_*> *)in_stack_ffffffffffffff88,(qsizetype)in_stack_ffffffffffffff80,
               (parameter_type)t);
    QAction::d_func((QAction *)0x368bc9);
    QList<QObject_*>::append((QList<QObject_*> *)0x368be3,in_RDI);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,local_18,local_10);
    QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_58);
    QActionEvent::~QActionEvent((QActionEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::insertAction(QAction *before, QAction *action)
{
    if (Q_UNLIKELY(!action)) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QWidget);
    if (d->actions.contains(action))
        removeAction(action);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    QActionPrivate *apriv = action->d_func();
    apriv->associatedObjects.append(this);

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}